

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O3

string * __thiscall
RealTrafficConnection::GetStatusText_abi_cxx11_
          (string *__return_storage_ptr__,RealTrafficConnection *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char sIntvl [100];
  string local_a8;
  char local_88 [104];
  
  iVar1 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel._vptr_LTChannel
            [6])(this);
  if (((char)iVar1 == '\0') ||
     (iVar1 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[10])(this), (char)iVar1 == '\0')) {
    LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
    return __return_storage_ptr__;
  }
  if (this->eConnType != RT_CONN_REQU_REPL) {
    if (this->status == RT_STATUS_NONE) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"Starting...","");
      return __return_storage_ptr__;
    }
    if ((this->status == RT_STATUS_STARTING) || (this->status == RT_STATUS_STOPPING)) {
      GetStatusStr_abi_cxx11_(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    GetStatusStr_abi_cxx11_(&local_a8,this);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((int)this->status < 2) {
      return __return_storage_ptr__;
    }
    if (4 < (int)this->status) {
      return __return_storage_ptr__;
    }
    if (this->lastReceivedTime <= 0.0) {
      return __return_storage_ptr__;
    }
    snprintf(local_88,100," | last msg %.0fs ago",dataRefs.lastSimTime - this->lastReceivedTime);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (this->tsAdjust <= 1.0) {
      return __return_storage_ptr__;
    }
    GetAdjustTSText_abi_cxx11_(&local_a8,this);
    snprintf(local_88,100," | historic traffic from %s",local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  switch((this->curr).eRequType) {
  case RT_REQU_AUTH:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Authenticating...";
    pcVar2 = "";
    break;
  case RT_REQU_DEAUTH:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "De-authenticating...";
    pcVar2 = "";
    break;
  case RT_REQU_PARKED:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Fetching parked aircraft...";
    pcVar2 = "";
    break;
  case RT_REQU_NEAREST_METAR:
  case RT_REQU_WEATHER:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "Fetching weather...";
    pcVar2 = "";
    break;
  default:
    LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
    goto LAB_001928b0;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
LAB_001928b0:
  if (0 < (this->curr).tOff) {
    GetAdjustTSText_abi_cxx11_(&local_a8,this);
    snprintf(local_88,100," | historic traffic from %s",local_a8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (this->lTotalFlights == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RealTrafficConnection::GetStatusText () const
{
    char sIntvl[100];

    // Invalid or disabled/off?
    if (!IsValid() || !IsEnabled())
        return LTChannel::GetStatusText();

    // --- Direct Connection? ---
    if (eConnType == RT_CONN_REQU_REPL) {
        std::string s =
            curr.eRequType == CurrTy::RT_REQU_AUTH          ? "Authenticating..." :
            curr.eRequType == CurrTy::RT_REQU_DEAUTH        ? "De-authenticating..." :
            curr.eRequType == CurrTy::RT_REQU_PARKED        ? "Fetching parked aircraft..." :
            curr.eRequType == CurrTy::RT_REQU_NEAREST_METAR ? "Fetching weather..." :
            curr.eRequType == CurrTy::RT_REQU_WEATHER       ? "Fetching weather..." :
            LTChannel::GetStatusText();
        if (isHistoric()) {                             // historic data?
            snprintf(sIntvl, sizeof(sIntvl), MSG_RT_ADJUST,
                     GetAdjustTSText().c_str());
            s += sIntvl;
        }
        if (lTotalFlights == 0) {                       // RealTraffic has no data at all???
            s += " | RealTraffic has no traffic at all! ";
            s += (isHistoric() ? "Maybe requested historic data too far in the past?" : "(full_count=0)");
        }
        return s;
    }
    
    // --- UDP/TCP connection ---
    // If we are waiting to establish a connection then we return RT-specific texts
    if (status == RT_STATUS_NONE)           return "Starting...";
    if (status == RT_STATUS_STARTING ||
        status == RT_STATUS_STOPPING)
        return GetStatusStr();
    
    // An active source of tracking data...for how many aircraft?
    std::string s = LTChannel::GetStatusText();
    // Add extended information specifically on RealTraffic connection status
    s += " | ";
    s += GetStatusStr();
    if (IsConnected() && lastReceivedTime > 0.0) {
        // add when the last msg was received
        snprintf(sIntvl,sizeof(sIntvl),MSG_RT_LAST_RCVD,
                 dataRefs.GetSimTime() - lastReceivedTime);
        s += sIntvl;
        // if receiving historic traffic say so
        if (tsAdjust > 1.0) {
            snprintf(sIntvl, sizeof(sIntvl), MSG_RT_ADJUST,
                     GetAdjustTSText().c_str());
            s += sIntvl;
        }
    }
    return s;
}